

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O1

ze_result_t driver::zesFirmwareSetSecurityVersionExp(zes_firmware_handle_t hFirmware)

{
  ze_result_t zVar1;
  
  if (DAT_0010ec90 != (code *)0x0) {
    zVar1 = (*DAT_0010ec90)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFirmwareSetSecurityVersionExp(
        zes_firmware_handle_t hFirmware                 ///< [in] Handle for the component.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnSetSecurityVersionExp = context.zesDdiTable.FirmwareExp.pfnSetSecurityVersionExp;
        if( nullptr != pfnSetSecurityVersionExp )
        {
            result = pfnSetSecurityVersionExp( hFirmware );
        }
        else
        {
            // generic implementation
        }

        return result;
    }